

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dict.c
# Opt level: O1

int dict_free(dict_t *d)

{
  int iVar1;
  dictword_t *pdVar2;
  void *pvVar3;
  int iVar4;
  long lVar5;
  long lVar6;
  
  iVar4 = 0;
  if (d != (dict_t *)0x0) {
    iVar1 = d->refcnt;
    iVar4 = iVar1 + -1;
    d->refcnt = iVar4;
    if (iVar1 < 2) {
      if (0 < d->n_word) {
        lVar5 = 8;
        lVar6 = 0;
        do {
          pdVar2 = d->word;
          pvVar3 = *(void **)((long)pdVar2 + lVar5 + -8);
          if (pvVar3 != (void *)0x0) {
            ckd_free(pvVar3);
          }
          pvVar3 = *(void **)((long)&pdVar2->word + lVar5);
          if (pvVar3 != (void *)0x0) {
            ckd_free(pvVar3);
          }
          lVar6 = lVar6 + 1;
          lVar5 = lVar5 + 0x20;
        } while (lVar6 < d->n_word);
      }
      if (d->word != (dictword_t *)0x0) {
        ckd_free(d->word);
      }
      if (d->ht != (hash_table_t *)0x0) {
        hash_table_free(d->ht);
      }
      if (d->mdef != (bin_mdef_t *)0x0) {
        bin_mdef_free(d->mdef);
      }
      ckd_free(d);
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int
dict_free(dict_t * d)
{
    int i;
    dictword_t *word;

    if (d == NULL)
        return 0;
    if (--d->refcnt > 0)
        return d->refcnt;

    /* First Step, free all memory allocated for each word */
    for (i = 0; i < d->n_word; i++) {
        word = (dictword_t *) & (d->word[i]);
        if (word->word)
            ckd_free((void *) word->word);
        if (word->ciphone)
            ckd_free((void *) word->ciphone);
    }

    if (d->word)
        ckd_free((void *) d->word);
    if (d->ht)
        hash_table_free(d->ht);
    if (d->mdef)
        bin_mdef_free(d->mdef);
    ckd_free((void *) d);

    return 0;
}